

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simUtils.c
# Opt level: O2

int Sim_UtilInfoCompare(Sim_Man_t *p,Abc_Obj_t *pNode)

{
  long lVar1;
  long lVar2;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (p->nSimWords <= lVar3) {
      return 1;
    }
    lVar1 = lVar3 * 4;
    lVar2 = lVar3 * 4;
    lVar3 = lVar3 + 1;
  } while (*(int *)((long)p->vSim1->pArray[pNode->Id] + lVar1) ==
           *(int *)((long)p->vSim0->pArray[pNode->Id] + lVar2));
  return 0;
}

Assistant:

int Sim_UtilInfoCompare( Sim_Man_t * p, Abc_Obj_t * pNode )
{
    unsigned * pSimInfo1, * pSimInfo2;
    int k;
    pSimInfo1 = (unsigned *)p->vSim0->pArray[pNode->Id];
    pSimInfo2 = (unsigned *)p->vSim1->pArray[pNode->Id];
    for ( k = 0; k < p->nSimWords; k++ )
        if ( pSimInfo2[k] != pSimInfo1[k] )
            return 0;
    return 1;
}